

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall
Minisat::ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
          (ClauseAllocator *this,vec<Minisat::Lit> *ps,bool learnt)

{
  uint extras_00;
  int size;
  Ref RVar1;
  byte in_DL;
  vec<Minisat::Lit> *in_RSI;
  vec<Minisat::Lit> *in_RDI;
  CRef cid;
  int extras;
  Ref in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  ushort uVar2;
  undefined1 learnt_00;
  undefined1 use_extra;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((in_DL & 1) == 0) {
    uVar2 = (ushort)(*(byte *)((long)&in_RDI[1].data + 4) & 1);
  }
  else {
    uVar2 = 2;
  }
  use_extra = 0;
  learnt_00 = 0;
  extras_00 = (uint)uVar2;
  size = vec<Minisat::Lit>::size(in_RSI);
  clauseWord32Size(size,extras_00);
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    ((RegionAllocator<unsigned_int> *)
                     CONCAT17(use_extra,
                              CONCAT16(learnt_00,CONCAT24(uVar2,in_stack_ffffffffffffffd0))),
                     in_stack_ffffffffffffffcc);
  lea((ClauseAllocator *)
      CONCAT17(use_extra,CONCAT16(learnt_00,CONCAT24(uVar2,in_stack_ffffffffffffffd0))),
      in_stack_ffffffffffffffcc);
  Clause::Clause<Minisat::vec<Minisat::Lit>>
            ((Clause *)CONCAT44(RVar1,in_stack_ffffffffffffffe0),in_RDI,(bool)use_extra,
             (bool)learnt_00);
  return RVar1;
}

Assistant:

CRef alloc(const Lits &ps, bool learnt = false)
    {
        assert(sizeof(Lit) == sizeof(uint32_t));
        assert(sizeof(float) == sizeof(uint32_t));
        int extras = learnt ? 2 : (int)extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extras));
        new (lea(cid)) Clause(ps, extra_clause_field, learnt);

        return cid;
    }